

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectMeshTextureCoords(XFileParser *this,Mesh *pMesh)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  aiVector2D aVar5;
  uint local_88;
  allocator<char> local_81;
  uint a;
  uint local_5c;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvStack_58;
  uint numCoords;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *coords;
  allocator<char> local_39;
  string local_38;
  Mesh *local_18;
  Mesh *pMesh_local;
  XFileParser *this_local;
  
  local_18 = pMesh;
  pMesh_local = (Mesh *)this;
  readHeadOfDataObject(this,(string *)0x0);
  if (8 < local_18->mNumTextures + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Too many sets of texture coordinates",&local_39);
    ThrowException(this,&local_38);
  }
  uVar1 = local_18->mNumTextures;
  local_18->mNumTextures = uVar1 + 1;
  pvStack_58 = local_18->mTexCoords + uVar1;
  local_5c = ReadInt(this);
  uVar2 = (ulong)local_5c;
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    (&local_18->mPositions);
  if (uVar2 != sVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&a,"Texture coord count does not match vertex count",&local_81);
    ThrowException(this,(string *)&a);
  }
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
            (pvStack_58,(ulong)local_5c);
  for (local_88 = 0; local_88 < local_5c; local_88 = local_88 + 1) {
    aVar5 = ReadVector2(this);
    pvVar4 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                       (pvStack_58,(ulong)local_88);
    pvVar4->x = aVar5.x;
    pvVar4->y = aVar5.y;
  }
  CheckForClosingBrace(this);
  return;
}

Assistant:

void XFileParser::ParseDataObjectMeshTextureCoords( Mesh* pMesh)
{
    readHeadOfDataObject();
    if( pMesh->mNumTextures + 1 > AI_MAX_NUMBER_OF_TEXTURECOORDS)
        ThrowException( "Too many sets of texture coordinates");

    std::vector<aiVector2D>& coords = pMesh->mTexCoords[pMesh->mNumTextures++];

    unsigned int numCoords = ReadInt();
    if( numCoords != pMesh->mPositions.size())
        ThrowException( "Texture coord count does not match vertex count");

    coords.resize( numCoords);
    for( unsigned int a = 0; a < numCoords; a++)
        coords[a] = ReadVector2();

    CheckForClosingBrace();
}